

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *this,Basis *fallback)

{
  Basis *fallback_local;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::GeomBasisCurves::Basis>::optional(&this->_attrib);
  this->_empty = false;
  this->_fallback = *fallback;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}